

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_record.c
# Opt level: O3

void rec_mm_equal(jit_State *J,RecordIndex *ix,int op)

{
  TRef TVar1;
  uint32_t uVar2;
  IRRef1 IVar3;
  int iVar4;
  TRef TVar5;
  TValue mo1v;
  TValue local_28;
  
  ix->tab = ix->val;
  ix->tabv = ix->valv;
  iVar4 = lj_record_mm_lookup(J,ix,MM_eq);
  if (iVar4 == 0) {
    return;
  }
  TVar1 = ix->mobj;
  local_28 = ix->mobjv;
  uVar2 = (ix->keyv).field_2.it;
  if (uVar2 == 0xfffffff3) {
    if (ix->mtv != (GCtab *)(ulong)*(uint *)((ulong)(ix->keyv).u32.lo + 0x10)) goto LAB_0012efb0;
    IVar3 = 9;
  }
  else {
    if ((uVar2 != 0xfffffff4) ||
       (ix->mtv != (GCtab *)(ulong)*(uint *)((ulong)(ix->keyv).u32.lo + 0x10))) {
LAB_0012efb0:
      ix->tab = ix->key;
      ix->tabv = ix->keyv;
      iVar4 = lj_record_mm_lookup(J,ix,MM_eq);
      if (iVar4 == 0) {
        return;
      }
      iVar4 = lj_record_objcmp(J,TVar1,ix->mobj,&local_28,&ix->mobjv);
      if (iVar4 != 0) {
        return;
      }
      goto LAB_0012f040;
    }
    IVar3 = 3;
  }
  TVar1 = ix->key;
  (J->fold).ins.field_0.ot = 0x430b;
  (J->fold).ins.field_0.op1 = (IRRef1)TVar1;
  (J->fold).ins.field_0.op2 = IVar3;
  TVar5 = lj_opt_fold(J);
  TVar1 = ix->mt;
  (J->fold).ins.field_0.ot = 0x88b;
  (J->fold).ins.field_0.op1 = (IRRef1)TVar5;
  (J->fold).ins.field_0.op2 = (IRRef1)TVar1;
  lj_opt_fold(J);
LAB_0012f040:
  rec_mm_callcomp(J,ix,op);
  return;
}

Assistant:

static void rec_mm_equal(jit_State *J, RecordIndex *ix, int op)
{
  ix->tab = ix->val;
  copyTV(J->L, &ix->tabv, &ix->valv);
  if (lj_record_mm_lookup(J, ix, MM_eq)) {  /* Lookup mm on 1st operand. */
    cTValue *bv;
    TRef mo1 = ix->mobj;
    TValue mo1v;
    copyTV(J->L, &mo1v, &ix->mobjv);
    /* Avoid the 2nd lookup and the objcmp if the metatables are equal. */
    bv = &ix->keyv;
    if (tvistab(bv) && tabref(tabV(bv)->metatable) == ix->mtv) {
      TRef mt2 = emitir(IRT(IR_FLOAD, IRT_TAB), ix->key, IRFL_TAB_META);
      emitir(IRTG(IR_EQ, IRT_TAB), mt2, ix->mt);
    } else if (tvisudata(bv) && tabref(udataV(bv)->metatable) == ix->mtv) {
      TRef mt2 = emitir(IRT(IR_FLOAD, IRT_TAB), ix->key, IRFL_UDATA_META);
      emitir(IRTG(IR_EQ, IRT_TAB), mt2, ix->mt);
    } else {  /* Lookup metamethod on 2nd operand and compare both. */
      ix->tab = ix->key;
      copyTV(J->L, &ix->tabv, bv);
      if (!lj_record_mm_lookup(J, ix, MM_eq) ||
	  lj_record_objcmp(J, mo1, ix->mobj, &mo1v, &ix->mobjv))
	return;
    }
    rec_mm_callcomp(J, ix, op);
  }
}